

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order_book.hh
# Opt level: O0

void __thiscall
helix::order::order(order *this,uint64_t id,uint64_t price,uint64_t quantity,side_type side,
                   uint64_t timestamp)

{
  uint64_t timestamp_local;
  side_type side_local;
  uint64_t quantity_local;
  uint64_t price_local;
  uint64_t id_local;
  order *this_local;
  
  this->level = (price_level *)0x0;
  this->id = id;
  this->price = price;
  this->quantity = quantity;
  this->side = side;
  this->timestamp = timestamp;
  return;
}

Assistant:

order(uint64_t id, uint64_t price, uint64_t quantity, side_type side, uint64_t timestamp)
        : level{nullptr}
        , id{id}
        , price{price}
        , quantity{quantity}
        , side{side}
        , timestamp{timestamp}
    {}